

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O0

void __thiscall util_tests::message_sign::test_method(message_sign *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  CKey privkey;
  string generated_signature;
  string expected_signature;
  string message;
  array<unsigned_char,_32UL> privkey_bytes;
  char *in_stack_fffffffffffffc78;
  lazy_ostream *in_stack_fffffffffffffc80;
  char *in_stack_fffffffffffffc88;
  undefined7 in_stack_fffffffffffffc90;
  undefined1 in_stack_fffffffffffffc97;
  string *in_stack_fffffffffffffc98;
  undefined7 in_stack_fffffffffffffca0;
  undefined1 in_stack_fffffffffffffca7;
  lazy_ostream *in_stack_fffffffffffffca8;
  const_string *in_stack_fffffffffffffcb0;
  const_string *file;
  undefined7 in_stack_fffffffffffffcb8;
  undefined1 in_stack_fffffffffffffcbf;
  char *in_stack_fffffffffffffcc0;
  undefined7 in_stack_fffffffffffffcc8;
  undefined1 in_stack_fffffffffffffccf;
  undefined1 local_290 [16];
  undefined1 local_280 [8];
  const_string local_240;
  lazy_ostream local_230 [2];
  assertion_result local_210;
  const_string local_1d8;
  lazy_ostream local_1c8 [2];
  assertion_result local_1a8 [2];
  const_string local_170;
  lazy_ostream local_160 [2];
  assertion_result local_140 [2];
  const_string local_108;
  lazy_ostream local_f8 [2];
  assertion_result local_d8 [3];
  allocator<char> local_8a;
  allocator<char> local_89;
  lazy_ostream local_88 [2];
  undefined1 local_68 [64];
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = 0x9f48980b0698f8b1;
  uStack_10 = 0x662803c0638409a3;
  local_28 = 0x6eda1cf108517fd9;
  uStack_20 = 0x2607ef0f42aabaee;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffccf,in_stack_fffffffffffffcc8),in_stack_fffffffffffffcc0
             ,(allocator<char> *)CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8));
  std::allocator<char>::~allocator(&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffccf,in_stack_fffffffffffffcc8),in_stack_fffffffffffffcc0
             ,(allocator<char> *)CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8));
  std::allocator<char>::~allocator(&local_8a);
  CKey::CKey((CKey *)in_stack_fffffffffffffc78);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffc97,in_stack_fffffffffffffc90));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc88,
               (pointer)in_stack_fffffffffffffc80,(unsigned_long)in_stack_fffffffffffffc78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc78);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8),
               in_stack_fffffffffffffcb0,(size_t)in_stack_fffffffffffffca8,
               (const_string *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0));
    CKey::IsValid((CKey *)in_stack_fffffffffffffc78);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffc88,
               SUB81((ulong)in_stack_fffffffffffffc80 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffc80,(char (*) [35])in_stack_fffffffffffffc78)
    ;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc88,
               (pointer)in_stack_fffffffffffffc80,(unsigned_long)in_stack_fffffffffffffc78);
    in_stack_fffffffffffffc78 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_d8,local_f8,&local_108,0x653,REQUIRE,CHECK_MSG);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[35],_const_char_(&)[35]>::
    ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[35],_const_char_(&)[35]>
                        *)in_stack_fffffffffffffc78);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffc78);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc88,
               (pointer)in_stack_fffffffffffffc80,(unsigned_long)in_stack_fffffffffffffc78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc78);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8),
               in_stack_fffffffffffffcb0,(size_t)in_stack_fffffffffffffca8,
               (const_string *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0));
    MessageSign((CKey *)in_stack_fffffffffffffca8,
                (string *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
                in_stack_fffffffffffffc98);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffc88,
               SUB81((ulong)in_stack_fffffffffffffc80 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffc80,(char (*) [33])in_stack_fffffffffffffc78)
    ;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc88,
               (pointer)in_stack_fffffffffffffc80,(unsigned_long)in_stack_fffffffffffffc78);
    in_stack_fffffffffffffc78 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion(local_140,local_160,&local_170,0x656,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[33],_const_char_(&)[33]>::
    ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[33],_const_char_(&)[33]>
                        *)in_stack_fffffffffffffc78);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffc78);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::array<unsigned_char,_32UL>::begin((array<unsigned_char,_32UL> *)in_stack_fffffffffffffc78);
  std::array<unsigned_char,_32UL>::end((array<unsigned_char,_32UL> *)in_stack_fffffffffffffc78);
  CKey::Set<unsigned_char_const*>
            ((CKey *)in_stack_fffffffffffffca8,
             (uchar *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
             (uchar *)in_stack_fffffffffffffc98,(bool)in_stack_fffffffffffffc97);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc88,
               (pointer)in_stack_fffffffffffffc80,(unsigned_long)in_stack_fffffffffffffc78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc78);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8),
               in_stack_fffffffffffffcb0,(size_t)in_stack_fffffffffffffca8,
               (const_string *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0));
    CKey::IsValid((CKey *)in_stack_fffffffffffffc78);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffc88,
               SUB81((ulong)in_stack_fffffffffffffc80 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffc80,(char (*) [33])in_stack_fffffffffffffc78)
    ;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc88,
               (pointer)in_stack_fffffffffffffc80,(unsigned_long)in_stack_fffffffffffffc78);
    in_stack_fffffffffffffc78 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1a8,local_1c8,&local_1d8,0x65b,REQUIRE,CHECK_MSG);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[33],_const_char_(&)[33]>::
    ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[33],_const_char_(&)[33]>
                        *)in_stack_fffffffffffffc78);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffc78);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc88,
               (pointer)in_stack_fffffffffffffc80,(unsigned_long)in_stack_fffffffffffffc78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc78);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8),
               in_stack_fffffffffffffcb0,(size_t)in_stack_fffffffffffffca8,
               (const_string *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0));
    MessageSign((CKey *)in_stack_fffffffffffffca8,
                (string *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0),
                in_stack_fffffffffffffc98);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_fffffffffffffc88,
               SUB81((ulong)in_stack_fffffffffffffc80 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffc80,(char (*) [30])in_stack_fffffffffffffc78)
    ;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc88,
               (pointer)in_stack_fffffffffffffc80,(unsigned_long)in_stack_fffffffffffffc78);
    in_stack_fffffffffffffc78 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion(&local_210,local_230,&local_240,0x65e,CHECK);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[30],_const_char_(&)[30]>::
    ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[30],_const_char_(&)[30]>
                        *)in_stack_fffffffffffffc78);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_fffffffffffffc78);
    in_stack_fffffffffffffcbf = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffcbf);
  do {
    file = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc88,
               (pointer)in_stack_fffffffffffffc80,(unsigned_long)in_stack_fffffffffffffc78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc78);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_fffffffffffffcbf,in_stack_fffffffffffffcb8),file
               ,(size_t)in_stack_fffffffffffffca8,
               (const_string *)CONCAT17(in_stack_fffffffffffffca7,in_stack_fffffffffffffca0));
    in_stack_fffffffffffffca8 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffffc80,(char (*) [1])in_stack_fffffffffffffc78);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffc88,
               (pointer)in_stack_fffffffffffffc80,(unsigned_long)in_stack_fffffffffffffc78);
    in_stack_fffffffffffffc88 = "generated_signature";
    in_stack_fffffffffffffc80 = local_88;
    in_stack_fffffffffffffc78 = "expected_signature";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_280,local_290,0x660,1,2,local_68);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffc78);
    in_stack_fffffffffffffca7 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_fffffffffffffca7);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc78);
  CKey::~CKey((CKey *)in_stack_fffffffffffffc78);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc78);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffc78);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(message_sign)
{
    const std::array<unsigned char, 32> privkey_bytes = {
        // just some random data
        // derived address from this private key: 15CRxFdyRpGZLW9w8HnHvVduizdL5jKNbs
        0xD9, 0x7F, 0x51, 0x08, 0xF1, 0x1C, 0xDA, 0x6E,
        0xEE, 0xBA, 0xAA, 0x42, 0x0F, 0xEF, 0x07, 0x26,
        0xB1, 0xF8, 0x98, 0x06, 0x0B, 0x98, 0x48, 0x9F,
        0xA3, 0x09, 0x84, 0x63, 0xC0, 0x03, 0x28, 0x66
    };

    const std::string message = "Trust no one";

    const std::string expected_signature =
        "IPojfrX2dfPnH26UegfbGQQLrdK844DlHq5157/P6h57WyuS/Qsl+h/WSVGDF4MUi4rWSswW38oimDYfNNUBUOk=";

    CKey privkey;
    std::string generated_signature;

    BOOST_REQUIRE_MESSAGE(!privkey.IsValid(),
        "Confirm the private key is invalid");

    BOOST_CHECK_MESSAGE(!MessageSign(privkey, message, generated_signature),
        "Sign with an invalid private key");

    privkey.Set(privkey_bytes.begin(), privkey_bytes.end(), true);

    BOOST_REQUIRE_MESSAGE(privkey.IsValid(),
        "Confirm the private key is valid");

    BOOST_CHECK_MESSAGE(MessageSign(privkey, message, generated_signature),
        "Sign with a valid private key");

    BOOST_CHECK_EQUAL(expected_signature, generated_signature);
}